

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O2

int ImpactGenerator::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  EffectData *pEVar1;
  ImpactInstance *pIVar2;
  int iVar3;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<ImpactGenerator::EffectData>(state);
  if (index < 4) {
    pEVar1->p[index] = value;
    iVar3 = 0;
    if (index == 3) {
      pIVar2 = GetImpactInstance((int)pEVar1->p[0]);
      iVar3 = 0;
      if (pIVar2 != (ImpactInstance *)0x0) {
        pIVar2->maximpacts = (int)value;
      }
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_MAXIMPACTS)
        {
            ImpactInstance* instance = GetImpactInstance((int)data->p[P_INSTANCE]);
            if (instance != NULL)
                instance->maximpacts = value;
        }
        return UNITY_AUDIODSP_OK;
    }